

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

uint32_t __thiscall ImgfsFile::allocchunk(ImgfsFile *this,uint size,chunktype_t tag)

{
  pointer pcVar1;
  ulong uVar2;
  uint uVar3;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  __first;
  undefined8 *puVar4;
  undefined7 in_register_00000011;
  long lVar5;
  uint32_t uVar6;
  long lVar7;
  value_type local_6d;
  undefined4 local_6c;
  chunkmap_t *local_68;
  string str;
  
  if (size == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = (this->_hdr).bytesperchunk;
    uVar2 = (ulong)size / (ulong)uVar3;
    if (size % uVar3 != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "allocchunk: unaligned size";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    uVar3 = (uint)uVar2;
    str._M_dataplus._M_p._0_1_ = 0x20;
    __first = std::
              __search_n<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,unsigned_int,__gnu_cxx::__ops::_Iter_equals_val<ImgfsFile::chunktype_t_const>>
                        ((__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                          )(this->_chunkmap).
                           super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                          )(this->_chunkmap).
                           super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish,uVar3,
                         (_Iter_equals_val<const_ImgfsFile::chunktype_t>)&str);
    if (__first._M_current ==
        (this->_chunkmap).
        super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_68 = &this->_chunkmap;
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>>,ImgfsFile::allocchunk(unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>
                (&str);
      pcVar1 = (this->_chunkmap).
               super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_6c = (undefined4)CONCAT71(in_register_00000011,tag);
      lVar5 = (long)str._M_dataplus._M_p - (long)pcVar1;
      lVar7 = (long)pcVar1 -
              (long)(this->_chunkmap).
                    super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_6d = FREECHUNK;
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                (local_68,(ulong)(((this->_hdr).chunksperblock - 1 |
                                  ((int)lVar7 + uVar3 + (int)lVar5) - 1) + 1),&local_6d);
      __first._M_current =
           (this->_chunkmap).
           super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>.
           _M_impl.super__Vector_impl_data._M_start + lVar5 + lVar7;
      tag = (chunktype_t)local_6c;
    }
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::
    for_each<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,ImgfsFile::allocchunk(unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_2_>
              (__first,(__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                        )(__first._M_current + uVar2),&str);
    uVar6 = ((int)__first._M_current -
            *(int *)&(this->_chunkmap).
                     super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) * (this->_hdr).bytesperchunk;
    markchunk(this,(ulong)uVar6,size,tag);
    std::__cxx11::string::~string((string *)&str);
  }
  return uVar6;
}

Assistant:

uint32_t allocchunk(unsigned size, chunktype_t tag)
    {
        if (size==0) return 0;
        if (size%_hdr.bytesperchunk)
            throw "allocchunk: unaligned size";

        unsigned n= size/_hdr.bytesperchunk;
        chunkmap_t::iterator i= std::search_n(_chunkmap.begin(), _chunkmap.end(), n, FREECHUNK);
        if (i==_chunkmap.end()) {
            // alloc more space from outer layer ( fffbfffd reader )
            auto last= std::find_if(_chunkmap.rbegin(), _chunkmap.rend(), [](chunktype_t t){ return t!=ImgfsFile::FREECHUNK; });
            size_t nfreeatend= last-_chunkmap.rbegin();
            size_t oldsize= _chunkmap.size();

            _chunkmap.resize(roundsize(_chunkmap.size()+n-nfreeatend, _hdr.chunksperblock), FREECHUNK);

//            printf("added %d chunks\n", (int)(_chunkmap.size()-oldsize));

            i= _chunkmap.begin()+oldsize-nfreeatend;
        }

        chunkmap_t::iterator end= i+n;
        std::string str;
        std::for_each(i, end, [&str](chunktype_t t){ str += (char)t; });

        unsigned ix= i-_chunkmap.begin();
        uint64_t ofs= ix*_hdr.bytesperchunk;
        //printf("allocchunk(%08x) ->: %06x:%06x:%08llx '%s'\n", size, int(i-_chunkmap.begin()), ix, ofs, str.c_str());
        markchunk(ofs, size, tag);
        if (ofs>>32)
            throw "allocchunk: offset too large";
        return (uint32_t)ofs;
    }